

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

const_iterator __thiscall
ArgumentParser::KeywordActionMap::Find(KeywordActionMap *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  pointer ppVar2;
  const_iterator cVar3;
  __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  local_50 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  *local_40;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  *local_38;
  __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  local_30;
  __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  it;
  KeywordActionMap *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (KeywordActionMap *)name._M_len;
  it._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)this;
  local_38 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
              *)std::
                vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                ::begin(&this->
                         super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       );
  local_40 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
              *)std::
                vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                ::end(&this->
                       super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     );
  local_30 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>const*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>>,std::basic_string_view<char,std::char_traits<char>>,ArgumentParser::KeywordActionMap::Find(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                       (local_38,local_40,&this_local);
  local_50[0]._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)std::
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ::end(&this->
                 super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               );
  bVar1 = __gnu_cxx::operator!=(&local_30,local_50);
  if (bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
             ::operator->(&local_30);
    __y._M_str = (char *)name_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar1 = std::operator==(ppVar2->first,__y);
    if (bVar1) {
      return (const_iterator)local_30._M_current;
    }
  }
  cVar3 = std::
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ::end(&this->
                 super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               );
  return (const_iterator)cVar3._M_current;
}

Assistant:

auto KeywordActionMap::Find(cm::string_view name) const -> const_iterator
{
  auto const it =
    std::lower_bound(this->begin(), this->end(), name,
                     [](value_type const& elem, cm::string_view const& k) {
                       return elem.first < k;
                     });
  return (it != this->end() && it->first == name) ? it : this->end();
}